

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O2

void __thiscall Automaton::buildReadsDigraph(Automaton *this)

{
  Name *this_00;
  Name *this_01;
  Node<Read> *this_02;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator other;
  Name extraout_RDX;
  Name extraout_RDX_00;
  Node<Read> *this_03;
  long in_FS_OFFSET;
  Read data;
  Read data_00;
  key_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = (Node<Read> *)&this->states;
  while (this_03 = *(Node<Read> **)this_03, this_03 != (Node<Read> *)&this->states) {
    this_00 = &this_03[1].data.nt;
    iVar2._M_node =
         (_Base_ptr)
         QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::begin
                   ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
    while( true ) {
      iVar3 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::end
                        ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00)
      ;
      if ((iterator)iVar2._M_node == iVar3.i._M_node) break;
      bVar1 = Grammar::isNonTerminal(this->_M_grammar,*(_List_node_base **)(iVar2._M_node + 1));
      if (bVar1) {
        this_02 = (Node<Read> *)iVar2._M_node[1]._M_parent;
        this_01 = &this_02[1].data.nt;
        iVar4._M_node =
             (_Base_ptr)
             QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::begin
                       ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_01);
        while( true ) {
          iVar3 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::end
                            ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                             this_01);
          if ((iterator)iVar4._M_node == iVar3.i._M_node) break;
          local_40._M_node = *(_List_node_base **)(iVar4._M_node + 1);
          bVar1 = Grammar::isNonTerminal(this->_M_grammar,(Name)local_40._M_node);
          if (bVar1) {
            iVar5 = std::
                    _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                    ::find(&(this->nullables)._M_t,&local_40);
            if ((_Rb_tree_header *)iVar5._M_node !=
                &(this->nullables)._M_t._M_impl.super__Rb_tree_header) {
              data.nt._M_node = extraout_RDX._M_node;
              data.state._M_node = *(_List_node_base **)(iVar2._M_node + 1);
              iVar6 = Node<Read>::get(this_03,data);
              data_00.nt._M_node = extraout_RDX_00._M_node;
              data_00.state._M_node = local_40._M_node;
              other = Node<Read>::get(this_02,data_00);
              Node<Read>::insertEdge((Node<Read> *)(iVar6._M_node + 1),other);
            }
          }
          iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node);
        }
      }
      iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Automaton::buildReadsDigraph ()
{
  for (StatePointer q = states.begin (); q != states.end (); ++q)
    {
      for (Bundle::iterator a = q->bundle.begin (); a != q->bundle.end (); ++a)
        {
          if (! _M_grammar->isNonTerminal (a.key ()))
            continue;

          StatePointer r = a.value ();

          for (Bundle::iterator z = r->bundle.begin (); z != r->bundle.end (); ++z)
            {
              Name sym = z.key ();

              if (! _M_grammar->isNonTerminal(sym) || nullables.find (sym) == nullables.end ())
                continue;

              ReadsGraph::iterator source = ReadsGraph::get (Read (q, a.key ()));
              ReadsGraph::iterator target = ReadsGraph::get (Read (r, sym));

              source->insertEdge (target);

#ifndef QLALR_NO_DEBUG_READS
              qerr() << "*** ";
              dump (qerr(), source);
              qerr() << " reads ";
              dump (qerr(), target);
              qerr() << Qt::endl;
#endif
            }
        }
    }
}